

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void JS_AddIntrinsicMapSet(JSContext *ctx)

{
  JSValue *pJVar1;
  bool bVar2;
  char *in_RCX;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  JSValue obj;
  JSValue JVar6;
  JSValue proto;
  char buf [64];
  char local_78 [72];
  
  lVar5 = 0;
  uVar4 = 0;
  do {
    in_RCX = JS_AtomGetStrRT(ctx->rt,local_78,(int)uVar4 + 0xaa,(JSAtom)in_RCX);
    pJVar1 = ctx->class_proto;
    JVar6 = JS_NewObjectProtoClass(ctx,pJVar1[1],1);
    *(JSValueUnion *)((long)&pJVar1[0x1f].u + lVar5 * 2) = JVar6.u;
    *(int64_t *)((long)&pJVar1[0x1f].tag + lVar5 * 2) = JVar6.tag;
    JVar6.tag = *(int64_t *)((long)&ctx->class_proto[0x1f].tag + lVar5 * 2);
    JVar6.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto[0x1f].u + lVar5 * 2))->ptr;
    JS_SetPropertyFunctionList
              (ctx,JVar6,*(JSCFunctionListEntry **)((long)js_map_proto_funcs_ptr + lVar5),
               (uint)"\f\v\x05\x04\x02\x02"[uVar4]);
    JVar6 = JS_NewCFunction3(ctx,js_map_constructor,in_RCX,0,JS_CFUNC_constructor_magic,(int)uVar4,
                             ctx->function_proto);
    if (uVar4 < 2) {
      JS_SetPropertyFunctionList(ctx,JVar6,js_map_funcs,1);
    }
    proto.tag = *(int64_t *)((long)&ctx->class_proto[0x1f].tag + lVar5 * 2);
    proto.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto[0x1f].u + lVar5 * 2))->ptr;
    JS_NewGlobalCConstructor2(ctx,JVar6,in_RCX,proto);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 8;
  } while (uVar4 != 4);
  lVar5 = 0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    pJVar1 = ctx->class_proto;
    JVar6 = JS_NewObjectProtoClass(ctx,ctx->iterator_proto,1);
    pJVar1[lVar5 + 0x23].u = JVar6.u;
    pJVar1[lVar5 + 0x23].tag = JVar6.tag;
    obj.tag = ctx->class_proto[lVar5 + 0x23].tag;
    obj.u.ptr = ctx->class_proto[lVar5 + 0x23].u.ptr;
    JS_SetPropertyFunctionList
              (ctx,obj,js_map_proto_funcs_ptr[lVar5 + 4],(uint)"\f\v\x05\x04\x02\x02"[lVar5 + 4]);
    lVar5 = 1;
    bVar2 = false;
  } while (bVar3);
  return;
}

Assistant:

void JS_AddIntrinsicMapSet(JSContext *ctx)
{
    int i;
    JSValue obj1;
    char buf[ATOM_GET_STR_BUF_SIZE];

    for(i = 0; i < 4; i++) {
        const char *name = JS_AtomGetStr(ctx, buf, sizeof(buf),
                                         JS_ATOM_Map + i);
        ctx->class_proto[JS_CLASS_MAP + i] = JS_NewObject(ctx);
        JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_MAP + i],
                                   js_map_proto_funcs_ptr[i],
                                   js_map_proto_funcs_count[i]);
        obj1 = JS_NewCFunctionMagic(ctx, js_map_constructor, name, 0,
                                    JS_CFUNC_constructor_magic, i);
        if (i < 2) {
            JS_SetPropertyFunctionList(ctx, obj1, js_map_funcs,
                                       countof(js_map_funcs));
        }
        JS_NewGlobalCConstructor2(ctx, obj1, name, ctx->class_proto[JS_CLASS_MAP + i]);
    }

    for(i = 0; i < 2; i++) {
        ctx->class_proto[JS_CLASS_MAP_ITERATOR + i] =
            JS_NewObjectProto(ctx, ctx->iterator_proto);
        JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_MAP_ITERATOR + i],
                                   js_map_proto_funcs_ptr[i + 4],
                                   js_map_proto_funcs_count[i + 4]);
    }
}